

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleComboBox::focusChild(QAccessibleComboBox *this)

{
  bool bVar1;
  QComboBox *this_00;
  QAccessibleInterface *pQVar2;
  
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (this_00 != (QComboBox *)0x0) {
    bVar1 = QComboBox::isEditable(this_00);
    if (bVar1) {
      pQVar2 = (QAccessibleInterface *)
               (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x48))(this,1);
      return pQVar2;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::focusChild() const
{
    // The editable combobox is the focus proxy of its lineedit, so the
    // lineedit itself never gets focus. But it is the accessible focus
    // child of an editable combobox.
    if (QComboBox *cBox = comboBox()) {
        if (cBox->isEditable())
            return child(1);
    }
    return nullptr;
}